

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall
Utf8Decode_LonelyStartCharacters_Test::TestBody(Utf8Decode_LonelyStartCharacters_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  allocator<unsigned_char> local_113;
  byte local_112 [2];
  byte *local_110;
  size_type local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  cpstring local_e8;
  byte local_c4;
  allocator<unsigned_char> local_c3;
  byte local_c2 [2];
  uint8_t v_2;
  byte *pbStack_c0;
  size_type local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  cpstring local_98;
  byte local_75;
  uint8_t v_1;
  allocator<unsigned_char> local_63;
  byte local_62 [2];
  byte *local_60;
  size_type local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  cpstring local_38;
  byte local_11;
  Utf8Decode_LonelyStartCharacters_Test *pUStack_10;
  uint8_t v;
  Utf8Decode_LonelyStartCharacters_Test *this_local;
  
  pUStack_10 = this;
  for (local_11 = 0xc0; local_11 < 0xe0; local_11 = local_11 + 1) {
    local_62[0] = local_11;
    local_62[1] = 0x20;
    local_60 = local_62;
    local_58 = 2;
    std::allocator<unsigned_char>::allocator(&local_63);
    __l_01._M_len = local_58;
    __l_01._M_array = local_60;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_50,__l_01,&local_63);
    (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_38,this,&local_50);
    std::__cxx11::u32string::~u32string((u32string *)&local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_50);
    std::allocator<unsigned_char>::~allocator(&local_63);
  }
  for (local_75 = 0xe0; local_75 < 0xf0; local_75 = local_75 + 1) {
    local_c2[0] = local_75;
    local_c2[1] = 0x20;
    pbStack_c0 = local_c2;
    local_b8 = 2;
    std::allocator<unsigned_char>::allocator(&local_c3);
    __l_00._M_len = local_b8;
    __l_00._M_array = pbStack_c0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_b0,__l_00,&local_c3);
    (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_98,this,&local_b0);
    std::__cxx11::u32string::~u32string((u32string *)&local_98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_b0);
    std::allocator<unsigned_char>::~allocator(&local_c3);
  }
  for (local_c4 = 0xf0; local_c4 < 0xf8; local_c4 = local_c4 + 1) {
    local_112[0] = local_c4;
    local_112[1] = 0x20;
    local_110 = local_112;
    local_108 = 2;
    std::allocator<unsigned_char>::allocator(&local_113);
    __l._M_len = local_108;
    __l._M_array = local_110;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_100,__l,&local_113);
    (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_e8,this,&local_100);
    std::__cxx11::u32string::~u32string((u32string *)&local_e8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_100);
    std::allocator<unsigned_char>::~allocator(&local_113);
  }
  return;
}

Assistant:

TEST_F (Utf8Decode, LonelyStartCharacters) {
    // All 32 first bytes of 2-byte sequences (0xC0-0xDF), each followed by a space character.
    for (std::uint8_t v = 0xC0; v <= 0xDF; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
    // All 16 first bytes of 3-byte sequences (0xE0-0xEF), each followed by a space character.
    for (std::uint8_t v = 0xE0; v <= 0xEF; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
    // All 8 first bytes of 4-byte sequences (0xF0-0xF7), each followed by a space character.
    for (std::uint8_t v = 0xF0; v <= 0xF7; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
}